

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void LodePNGIText_cleanup(LodePNGInfo *info)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = 0;
  for (sVar2 = 0; sVar2 != info->itext_num; sVar2 = sVar2 + 1) {
    string_cleanup((char **)((long)info->itext_keys + lVar1));
    string_cleanup((char **)((long)info->itext_langtags + lVar1));
    string_cleanup((char **)((long)info->itext_transkeys + lVar1));
    string_cleanup((char **)((long)info->itext_strings + lVar1));
    lVar1 = lVar1 + 8;
  }
  free(info->itext_keys);
  free(info->itext_langtags);
  free(info->itext_transkeys);
  free(info->itext_strings);
  return;
}

Assistant:

static void LodePNGIText_cleanup(LodePNGInfo* info)
{
  size_t i;
  for(i = 0; i != info->itext_num; ++i)
  {
    string_cleanup(&info->itext_keys[i]);
    string_cleanup(&info->itext_langtags[i]);
    string_cleanup(&info->itext_transkeys[i]);
    string_cleanup(&info->itext_strings[i]);
  }
  lodepng_free(info->itext_keys);
  lodepng_free(info->itext_langtags);
  lodepng_free(info->itext_transkeys);
  lodepng_free(info->itext_strings);
}